

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCommit(Btree *p)

{
  int iVar1;
  
  sqlite3BtreeEnter(p);
  iVar1 = sqlite3BtreeCommitPhaseOne(p,(char *)0x0);
  if (iVar1 == 0) {
    iVar1 = sqlite3BtreeCommitPhaseTwo(p,0);
  }
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommit(Btree *p){
  int rc;
  sqlite3BtreeEnter(p);
  rc = sqlite3BtreeCommitPhaseOne(p, 0);
  if( rc==SQLITE_OK ){
    rc = sqlite3BtreeCommitPhaseTwo(p, 0);
  }
  sqlite3BtreeLeave(p);
  return rc;
}